

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O3

void anon_unknown.dwarf_1ee9f1::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  pointer pWVar1;
  pointer pWVar2;
  LineOrder LVar3;
  Compression CVar4;
  pointer pcVar5;
  FrameBuffer *pFVar6;
  size_type sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Header *pHVar13;
  size_type *psVar14;
  long *plVar15;
  pointer pWVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  int iVar24;
  int iVar25;
  ostream *poVar26;
  ChannelList *pCVar27;
  TileDescription *tileDesc;
  TaskGroup TVar28;
  Data *pDVar29;
  ulong *puVar30;
  ThreadPool *pTVar31;
  pointer ppWVar32;
  TaskGroup *pTVar33;
  Header *pHVar34;
  Box2i *pBVar35;
  Box2i *pBVar36;
  float *pfVar37;
  V2f *pVVar38;
  V2f *pVVar39;
  LineOrder *pLVar40;
  Compression *pCVar41;
  ConstIterator CVar42;
  Iterator IVar43;
  ChannelList *other;
  string *psVar44;
  string *psVar45;
  Task *pTVar46;
  undefined4 uVar47;
  ulong *puVar48;
  Header *this;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_00;
  uint uVar49;
  uint uVar50;
  int iVar51;
  ulong uVar52;
  WritingTaskData *pWVar53;
  size_t sVar54;
  ulong uVar55;
  size_type *psVar56;
  size_type sVar57;
  void *pvVar58;
  Data *frameBuffer;
  ulong uVar59;
  Array2D<Imf_2_5::FrameBuffer> *pAVar60;
  pointer ppWVar61;
  size_type *psVar62;
  ulong uVar63;
  long lVar64;
  long lVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  TaskGroup taskGroup;
  MultiPartOutputFile file;
  Array2D<float> floatData;
  int numYLevel;
  int numXLevel;
  Array2D<unsigned_int> uintData;
  Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_> tiledFrameBuffers;
  Array2D<half> halfData;
  vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> frameBuffers;
  string fn;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  vector<void_*,_std::allocator<void_*>_> parts;
  pointer local_388;
  pointer local_380;
  long local_378;
  size_type local_370;
  _func_int *local_368;
  TaskGroup local_358;
  uint local_34c;
  string local_348;
  Array2D<Imf_2_5::FrameBuffer> *local_320;
  Array2D<float> local_318;
  ulong local_2f8;
  int local_2f0;
  int local_2ec;
  Array2D<unsigned_int> local_2e8;
  Task *local_2d0;
  Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_> local_2c8;
  Array2D<half> local_2b8;
  undefined1 local_298 [16];
  _Base_ptr local_288;
  ulong local_260;
  size_type *local_258;
  size_type *local_250;
  size_type *local_248;
  ulong local_240;
  long *local_238 [2];
  long local_228 [2];
  int local_214;
  int local_210;
  int local_20c;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  local_208;
  ThreadPool *local_1e8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_type *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  local_210 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_34c = partNumber;
  poVar26 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar26," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar26 + -0x18) + (char)poVar26);
  std::ostream::put((char)poVar26);
  std::ostream::flush();
  std::ostream::flush();
  local_238[0] = local_228;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_238);
  local_214 = runCount;
  if (0 < runCount) {
    local_2f8 = (ulong)local_34c;
    local_1c0 = local_2f8 * 0x18 + 8;
    local_1c8 = ((local_2f8 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar18 = 0;
    do {
      local_2b8._sizeX = 0;
      local_2b8._sizeY = 0;
      local_2b8._data = (half *)0x0;
      local_318._data = (float *)0x0;
      local_318._sizeX = 0;
      local_318._sizeY = 0;
      local_2e8._data = (uint *)0x0;
      local_2e8._sizeX = 0;
      local_2e8._sizeY = 0;
      local_20c = iVar18;
      fillPixels<unsigned_int>(&local_2e8,0xc5,0x107);
      fillPixels<half>(&local_2b8,0xc5,0x107);
      fillPixels<float>(&local_318,0xc5,0x107);
      uVar63 = local_1c0;
      local_1d0 = (size_type *)operator_new__(local_1c0);
      sVar8 = local_1c8;
      uVar59 = local_2f8;
      *local_1d0 = local_2f8;
      local_248 = local_1d0 + 1;
      memset(local_248,0,local_1c8);
      local_1d8 = (size_type *)operator_new__(uVar63);
      *local_1d8 = uVar59;
      local_250 = local_1d8 + 1;
      memset(local_250,0,sVar8);
      local_1e0 = (size_type *)operator_new__(uVar63);
      *local_1e0 = uVar59;
      local_258 = local_1e0 + 1;
      memset(local_258,0,sVar8);
      local_208.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.
      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar59);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_2f8);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_2f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar13 = DAT_004a2bc0;
      pHVar34 = (anonymous_namespace)::headers;
      this = (anonymous_namespace)::headers;
      if (DAT_004a2bc0 != (anonymous_namespace)::headers) {
        do {
          Imf_2_5::Header::~Header(this);
          this = this + 1;
        } while (this != pHVar13);
        DAT_004a2bc0 = pHVar34;
      }
      if (0 < (int)local_34c) {
        sVar57 = 0;
        do {
          local_1b8._0_4_ = 0.0;
          local_1b8._4_4_ = 0.0;
          Imf_2_5::Header::Header
                    ((Header *)local_298,0xc5,0x107,1.0,(V2f *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar18 = random_int(3);
          iVar19 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar57 * 4) = iVar18;
          *(int *)((anonymous_namespace)::partTypes + sVar57 * 4) = iVar19;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar22 = (int)sVar57;
          std::ostream::operator<<(&local_1a8,iVar22);
          std::__cxx11::stringbuf::str();
          Imf_2_5::Header::setName((Header *)local_298,&local_348);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p != &local_348.field_2) {
            operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
          }
          if (iVar18 == 0) {
            pCVar27 = Imf_2_5::Header::channels((Header *)local_298);
            Imf_2_5::Channel::Channel((Channel *)&local_348,UINT,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar27,"UINT",(Channel *)&local_348);
          }
          else if (iVar18 == 1) {
            pCVar27 = Imf_2_5::Header::channels((Header *)local_298);
            Imf_2_5::Channel::Channel((Channel *)&local_348,FLOAT,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar27,"FLOAT",(Channel *)&local_348);
          }
          else if (iVar18 == 2) {
            pCVar27 = Imf_2_5::Header::channels((Header *)local_298);
            Imf_2_5::Channel::Channel((Channel *)&local_348,HALF,1,1,false);
            Imf_2_5::ChannelList::insert(pCVar27,"HALF",(Channel *)&local_348);
          }
          if (iVar19 == 1) {
            Imf_2_5::Header::setType((Header *)local_298,(string *)Imf_2_5::TILEDIMAGE_abi_cxx11_);
            iVar18 = random_int(0xc5);
            iVar19 = random_int(0x107);
            uVar50 = random_int(3);
            *(uint *)((anonymous_namespace)::levelModes + sVar57 * 4) = uVar50;
            uVar49 = 3;
            if (uVar50 < 3) {
              uVar49 = uVar50;
            }
            local_348._M_dataplus._M_p._4_4_ = iVar19 + 1;
            local_348._M_dataplus._M_p._0_4_ = iVar18 + 1;
            local_348._M_string_length = (size_type)uVar49;
            Imf_2_5::Header::setTileDescription((Header *)local_298,(TileDescription *)&local_348);
            bVar17 = uVar50 != 1;
LAB_00179fe6:
            tileDesc = Imf_2_5::Header::tileDescription((Header *)local_298);
            Imf_2_5::precalculateTileInfo
                      (tileDesc,0,0xc4,0,0x106,(int **)&local_2c8,(int **)&local_358,&local_2ec,
                       &local_2f0);
            if (0 < local_2ec) {
              lVar64 = 0;
              iVar18 = local_2ec;
              iVar19 = local_2f0;
              do {
                if (0 < iVar19) {
                  lVar65 = 0;
                  do {
                    if ((!(bool)(~bVar17 & lVar64 != lVar65)) &&
                       (0 < *(int *)(local_2c8._size + lVar64 * 4))) {
                      iVar18 = 0;
                      TVar28._data = local_358._data;
                      pvVar58 = (void *)local_2c8._size;
                      do {
                        if (0 < (&(TVar28._data)->numPending)[lVar65].super___atomic_base<int>._M_i)
                        {
                          iVar19 = 0;
                          do {
                            local_348._M_dataplus._M_p = (pointer)CONCAT44(iVar18,iVar22);
                            local_348._M_string_length = CONCAT44((int)lVar64,iVar19);
                            local_348.field_2._M_allocated_capacity._0_4_ = (int)lVar65;
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back(&local_208,(value_type *)&local_348);
                            iVar19 = iVar19 + 1;
                            TVar28._data = local_358._data;
                            pvVar58 = (void *)local_2c8._size;
                          } while (iVar19 < (&(local_358._data)->numPending)[lVar65].
                                            super___atomic_base<int>._M_i);
                        }
                        iVar18 = iVar18 + 1;
                        iVar19 = local_2f0;
                      } while (iVar18 < *(int *)((long)pvVar58 + lVar64 * 4));
                    }
                    lVar65 = lVar65 + 1;
                    iVar18 = local_2ec;
                  } while (lVar65 < iVar19);
                }
                lVar64 = lVar64 + 1;
              } while (lVar64 < iVar18);
            }
            if ((void *)local_2c8._size != (void *)0x0) {
              operator_delete__((void *)local_2c8._size);
            }
            if (local_358._data != (Data *)0x0) {
              operator_delete__(local_358._data);
            }
          }
          else {
            bVar17 = true;
            if (iVar19 != 0) goto LAB_00179fe6;
            Imf_2_5::Header::setType
                      ((Header *)local_298,(string *)Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
            iVar18 = 0x107;
            do {
              local_348._M_dataplus._M_p._0_4_ = iVar22;
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back(&local_208,(value_type *)&local_348);
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
                    ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)local_298);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_2_5::Header::~Header((Header *)local_298);
          sVar57 = sVar57 + 1;
        } while (sVar57 != local_2f8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pWVar16 = local_208.
                super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar63 = ((long)local_208.
                      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_208.
                      super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
      poVar26 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar26," tasks ",7);
      std::ostream::flush();
      iVar18 = (int)uVar63;
      uVar59 = uVar63 & 0xffffffff;
      if (0 < iVar18) {
        do {
          iVar20 = random_int(iVar18);
          iVar21 = random_int(iVar18);
          iVar19 = pWVar16[iVar20].ly;
          local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,iVar19);
          pWVar1 = pWVar16 + iVar20;
          local_1b8._0_4_ = pWVar1->partNumber;
          local_1b8._4_4_ = pWVar1->tx;
          uStack_1b0 = *(Data **)&pWVar1->ty;
          pWVar16[iVar20].ly = pWVar16[iVar21].ly;
          pWVar1 = pWVar16 + iVar21;
          iVar22 = pWVar1->tx;
          iVar51 = pWVar1->ty;
          iVar24 = pWVar1->lx;
          pWVar2 = pWVar16 + iVar20;
          pWVar2->partNumber = pWVar1->partNumber;
          pWVar2->tx = iVar22;
          pWVar2->ty = iVar51;
          pWVar2->lx = iVar24;
          pWVar16[iVar21].ly = iVar19;
          pWVar1 = pWVar16 + iVar21;
          pWVar1->partNumber = local_1b8._0_4_;
          pWVar1->tx = local_1b8._4_4_;
          *(Data **)&pWVar1->ty = uStack_1b0;
          uVar49 = (int)uVar59 - 1;
          uVar59 = (ulong)uVar49;
        } while (uVar49 != 0);
      }
      local_260 = uVar63;
      remove((char *)local_238[0]);
      plVar15 = local_238[0];
      pHVar13 = DAT_004a2bc0;
      pHVar34 = (anonymous_namespace)::headers;
      iVar18 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)&local_348,(char *)plVar15,pHVar34,
                 (int)((ulong)((long)pHVar13 - (long)pHVar34) >> 3) * -0x49249249,false,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar59 = local_2f8;
      local_1b8._0_4_ = 0.0;
      local_1b8._4_4_ = 0.0;
      uStack_1b0 = (Data *)0x0;
      local_1a8 = (_Base_ptr)0x0;
      std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::vector
                ((vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> *)local_298,
                 local_2f8,(allocator_type *)&local_2c8);
      Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::Array(&local_2c8,uVar59);
      if (0 < (int)local_34c) {
        uVar59 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar59 * 4) == 0) {
            pDVar29 = (Data *)operator_new(8);
            Imf_2_5::OutputPart::OutputPart
                      ((OutputPart *)pDVar29,(MultiPartOutputFile *)&local_348,(int)uVar59);
            local_358._data = pDVar29;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_358._data);
            frameBuffer = (Data *)(local_298._0_8_ + uVar59 * 0x30);
            setOutputFrameBuffer
                      ((FrameBuffer *)frameBuffer,
                       *(int *)((anonymous_namespace)::pixelTypes + uVar59 * 4),
                       (Array2D<unsigned_int> *)local_2e8._data,(Array2D<float> *)local_318._data,
                       (Array2D<half> *)local_2b8._data,0xc5);
            Imf_2_5::OutputPart::setFrameBuffer((OutputPart *)pDVar29,(FrameBuffer *)frameBuffer);
          }
          else {
            pDVar29 = (Data *)operator_new(8);
            Imf_2_5::TiledOutputPart::TiledOutputPart
                      ((TiledOutputPart *)pDVar29,(MultiPartOutputFile *)&local_348,(int)uVar59);
            local_358._data = pDVar29;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_358._data);
            uVar49 = Imf_2_5::TiledOutputPart::numXLevels((TiledOutputPart *)pDVar29);
            iVar19 = Imf_2_5::TiledOutputPart::numYLevels((TiledOutputPart *)pDVar29);
            local_320 = (Array2D<Imf_2_5::FrameBuffer> *)CONCAT44(local_320._4_4_,iVar19);
            iVar18 = *(int *)((anonymous_namespace)::pixelTypes + uVar59 * 4);
            if (iVar18 == 0) {
              uVar52 = (long)iVar19 * (long)(int)uVar49;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar52;
              uVar63 = SUB168(auVar11 * ZEXT816(0x18),0);
              uVar55 = uVar63 + 8;
              if (0xfffffffffffffff7 < uVar63) {
                uVar55 = 0xffffffffffffffff;
              }
              if (SUB168(auVar11 * ZEXT816(0x18),8) != 0) {
                uVar55 = 0xffffffffffffffff;
              }
              puVar30 = (ulong *)operator_new__(uVar55);
              *puVar30 = uVar52;
              puVar30 = puVar30 + 1;
              if (uVar52 != 0) {
                memset(puVar30,0,((uVar63 - 0x18) / 0x18) * 0x18 + 0x18);
              }
              psVar56 = local_258 + uVar59 * 3;
              sVar57 = psVar56[2];
              if (sVar57 != 0) {
                local_378 = *(long *)(sVar57 - 8);
                pvVar58 = (void *)(sVar57 - 8);
                if (local_378 != 0) {
                  lVar64 = local_378 * 0x18;
                  do {
                    if (*(void **)((long)pvVar58 + lVar64) != (void *)0x0) {
                      operator_delete__(*(void **)((long)pvVar58 + lVar64));
                    }
                    lVar64 = lVar64 + -0x18;
                  } while (lVar64 != 0);
                }
LAB_0017a6ec:
                operator_delete__(pvVar58,local_378 * 0x18 + 8);
              }
LAB_0017a705:
              local_368 = (_func_int *)(long)iVar19;
              local_370 = (size_type)(int)uVar49;
              *psVar56 = (size_type)local_368;
              psVar56[1] = local_370;
              psVar56[2] = (size_type)puVar30;
            }
            else {
              if (iVar18 == 1) {
                uVar52 = (long)iVar19 * (long)(int)uVar49;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = uVar52;
                uVar63 = SUB168(auVar10 * ZEXT816(0x18),0);
                uVar55 = uVar63 + 8;
                if (0xfffffffffffffff7 < uVar63) {
                  uVar55 = 0xffffffffffffffff;
                }
                if (SUB168(auVar10 * ZEXT816(0x18),8) != 0) {
                  uVar55 = 0xffffffffffffffff;
                }
                puVar30 = (ulong *)operator_new__(uVar55);
                *puVar30 = uVar52;
                puVar30 = puVar30 + 1;
                if (uVar52 != 0) {
                  memset(puVar30,0,((uVar63 - 0x18) / 0x18) * 0x18 + 0x18);
                }
                psVar56 = local_250 + uVar59 * 3;
                sVar57 = psVar56[2];
                if (sVar57 != 0) {
                  local_378 = *(long *)(sVar57 - 8);
                  pvVar58 = (void *)(sVar57 - 8);
                  if (local_378 != 0) {
                    lVar64 = local_378 * 0x18;
                    do {
                      if (*(void **)((long)pvVar58 + lVar64) != (void *)0x0) {
                        operator_delete__(*(void **)((long)pvVar58 + lVar64));
                      }
                      lVar64 = lVar64 + -0x18;
                    } while (lVar64 != 0);
                  }
                  goto LAB_0017a6ec;
                }
                goto LAB_0017a705;
              }
              if (iVar18 == 2) {
                uVar52 = (long)iVar19 * (long)(int)uVar49;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = uVar52;
                uVar63 = SUB168(auVar9 * ZEXT816(0x18),0);
                uVar55 = uVar63 + 8;
                if (0xfffffffffffffff7 < uVar63) {
                  uVar55 = 0xffffffffffffffff;
                }
                if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
                  uVar55 = 0xffffffffffffffff;
                }
                puVar30 = (ulong *)operator_new__(uVar55);
                *puVar30 = uVar52;
                puVar30 = puVar30 + 1;
                if (uVar52 != 0) {
                  memset(puVar30,0,((uVar63 - 0x18) / 0x18) * 0x18 + 0x18);
                }
                psVar56 = local_248 + uVar59 * 3;
                sVar57 = psVar56[2];
                if (sVar57 != 0) {
                  local_378 = *(long *)(sVar57 - 8);
                  pvVar58 = (void *)(sVar57 - 8);
                  if (local_378 != 0) {
                    lVar64 = local_378 * 0x18;
                    do {
                      if (*(void **)((long)pvVar58 + lVar64) != (void *)0x0) {
                        operator_delete__(*(void **)((long)pvVar58 + lVar64));
                      }
                      lVar64 = lVar64 + -0x18;
                    } while (lVar64 != 0);
                  }
                  goto LAB_0017a6ec;
                }
                goto LAB_0017a705;
              }
              uVar52 = (long)iVar19 * (long)(int)uVar49;
            }
            local_368 = (_func_int *)(long)iVar19;
            local_370 = (size_type)(int)uVar49;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = uVar52;
            uVar63 = SUB168(auVar12 * ZEXT816(0x30),0) | 8;
            if (SUB168(auVar12 * ZEXT816(0x30),8) != 0) {
              uVar63 = 0xffffffffffffffff;
            }
            local_2d0 = (Task *)(uVar59 * 3);
            pAVar60 = local_2c8._data + uVar59;
            puVar30 = (ulong *)operator_new__(uVar63);
            *puVar30 = uVar52;
            if (uVar52 != 0) {
              lVar64 = uVar52 * 0x30;
              puVar48 = puVar30 + 2;
              do {
                *(undefined4 *)puVar48 = 0;
                puVar48[1] = 0;
                puVar48[2] = (ulong)puVar48;
                puVar48[3] = (ulong)puVar48;
                puVar48[4] = 0;
                puVar48 = puVar48 + 6;
                lVar64 = lVar64 + -0x30;
              } while (lVar64 != 0);
            }
            pFVar6 = pAVar60->_data;
            if (pFVar6 != (FrameBuffer *)0x0) {
              sVar54 = pFVar6[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (sVar54 != 0) {
                lVar64 = sVar54 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                               *)(&pFVar6[-1]._map._M_t._M_impl.field_0x0 + lVar64));
                  lVar64 = lVar64 + -0x30;
                } while (lVar64 != 0);
              }
              operator_delete__(&pFVar6[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                sVar54 * 0x30 + 8);
            }
            psVar14 = local_248;
            psVar62 = local_250;
            psVar56 = local_258;
            pAVar60->_sizeX = (long)local_368;
            pAVar60->_sizeY = local_370;
            pAVar60->_data = (FrameBuffer *)(puVar30 + 1);
            if (0 < (int)uVar49) {
              local_240 = (ulong)uVar49;
              uVar63 = (ulong)local_320 & 0xffffffff;
              uVar52 = 0;
              do {
                if (0 < (int)local_320) {
                  uVar55 = 0;
                  do {
                    bVar17 = Imf_2_5::TiledOutputPart::isValidLevel
                                       ((TiledOutputPart *)pDVar29,(int)uVar52,(int)uVar55);
                    if (bVar17) {
                      iVar19 = Imf_2_5::TiledOutputPart::levelWidth
                                         ((TiledOutputPart *)pDVar29,(int)uVar52);
                      iVar22 = Imf_2_5::TiledOutputPart::levelHeight
                                         ((TiledOutputPart *)pDVar29,(int)uVar55);
                      lVar64 = (&(local_2c8._data)->_sizeY)[(long)local_2d0];
                      pFVar6 = (&(local_2c8._data)->_data)[(long)local_2d0];
                      iVar18 = *(int *)((anonymous_namespace)::pixelTypes + uVar59 * 4);
                      if (iVar18 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   (psVar56[uVar59 * 3 + 1] * uVar55 * 0x18 +
                                    psVar56[uVar59 * 3 + 2] + uVar52 * 0x18),iVar19,iVar22);
                      }
                      else if (iVar18 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (psVar62[uVar59 * 3 + 1] * uVar55 * 0x18 +
                                           psVar62[uVar59 * 3 + 2] + uVar52 * 0x18),iVar19,iVar22);
                      }
                      else if (iVar18 == 2) {
                        fillPixels<half>((Array2D<half> *)
                                         (psVar14[uVar59 * 3 + 1] * uVar55 * 0x18 +
                                          psVar14[uVar59 * 3 + 2] + uVar52 * 0x18),iVar19,iVar22);
                      }
                      lVar65 = uVar52 * 0x18;
                      setOutputFrameBuffer
                                (pFVar6 + lVar64 * uVar55 + uVar52,
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar59 * 4),
                                 *(Array2D<unsigned_int> **)
                                  (psVar56[uVar59 * 3 + 1] * uVar55 * 0x18 + psVar56[uVar59 * 3 + 2]
                                   + 0x10 + lVar65),
                                 *(Array2D<float> **)
                                  (psVar62[uVar59 * 3 + 1] * uVar55 * 0x18 + psVar62[uVar59 * 3 + 2]
                                   + 0x10 + lVar65),
                                 *(Array2D<half> **)
                                  (psVar14[uVar59 * 3 + 1] * uVar55 * 0x18 + psVar14[uVar59 * 3 + 2]
                                   + 0x10 + lVar65),iVar19);
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar63 != uVar55);
                }
                uVar52 = uVar52 + 1;
              } while (uVar52 != local_240);
            }
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 != local_2f8);
      }
      IlmThread_2_5::TaskGroup::TaskGroup(&local_358);
      pTVar31 = (ThreadPool *)operator_new(0x10);
      IlmThread_2_5::ThreadPool::ThreadPool(pTVar31,0x20);
      uVar49 = (uint)local_260;
      if ((int)uVar49 < 1) {
        local_380 = (pointer)0x0;
        local_388 = (pointer)0x0;
      }
      else {
        local_260 = -(ulong)(uVar49 & 0x7fffffff);
        local_240 = -(ulong)(uVar49 - 1);
        lVar64 = 0;
        sVar54 = 0;
        uVar59 = 0;
        local_388 = (pointer)0x0;
        local_380 = (pointer)0x0;
        ppWVar61 = (pointer)0x0;
        local_1e8 = pTVar31;
        do {
          pWVar53 = (WritingTaskData *)
                    ((long)&(local_208.
                             super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->partNumber + lVar64);
          iVar18 = (int)sVar54;
          if (ppWVar61 == local_380) {
            uVar63 = (long)local_380 - (long)local_388;
            if (uVar63 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar55 = (long)uVar63 >> 3;
            uVar52 = 1;
            if (local_380 != local_388) {
              uVar52 = uVar55;
            }
            this_00 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar52 + uVar55);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < this_00) {
              this_00 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            if (CARRY8(uVar52,uVar55)) {
              this_00 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            ppWVar32 = std::
                       _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ::_M_allocate(this_00,sVar54);
            *(WritingTaskData **)((long)ppWVar32 + uVar63) = pWVar53;
            if (0 < (long)uVar63) {
              memmove(ppWVar32,local_388,uVar63);
            }
            if (local_388 != (pointer)0x0) {
              operator_delete(local_388,uVar63);
            }
            ppWVar61 = (pointer)(uVar63 + (long)ppWVar32);
            local_380 = ppWVar32 + (long)this_00;
            local_388 = ppWVar32;
          }
          else {
            *ppWVar61 = pWVar53;
          }
          ppWVar61 = ppWVar61 + 1;
          if (((int)(sVar54 / 10) * -10 == (int)uVar59) || (local_240 == uVar59)) {
            local_2d0 = (Task *)operator_new(0x38);
            uVar63 = (long)ppWVar61 - (long)local_388;
            ppWVar32 = std::
                       _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                      *)((long)uVar63 >> 3),sVar54);
            if (ppWVar61 != local_388) {
              memmove(ppWVar32,local_388,uVar63);
            }
            pTVar46 = local_2d0;
            local_320 = local_2c8._data;
            pTVar33 = &local_358;
            IlmThread_2_5::Task::Task(local_2d0,pTVar33);
            pTVar46->_vptr_Task = (_func_int **)&PTR__WritingTask_0049c4d8;
            pTVar46[1]._vptr_Task = (_func_int **)&local_348;
            pTVar46[1]._group = (TaskGroup *)0x0;
            pTVar46[2]._vptr_Task = (_func_int **)0x0;
            pTVar46[2]._group = (TaskGroup *)0x0;
            pTVar33 = (TaskGroup *)
                      std::
                      _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                     *)((long)uVar63 >> 3),(size_t)pTVar33);
            pTVar31 = local_1e8;
            pTVar46[1]._group = pTVar33;
            pTVar46[2]._vptr_Task = (_func_int **)pTVar33;
            pTVar46[2]._group = (TaskGroup *)((long)pTVar33 + uVar63);
            if (ppWVar61 != local_388) {
              memcpy(pTVar33,ppWVar32,uVar63);
            }
            pTVar46[2]._vptr_Task = (_func_int **)((long)pTVar33 + uVar63);
            pTVar46[3]._vptr_Task = (_func_int **)local_320;
            IlmThread_2_5::ThreadPool::addTask(pTVar31,pTVar46);
            ppWVar61 = local_388;
            if (ppWVar32 != (pointer)0x0) {
              operator_delete(ppWVar32,uVar63);
            }
          }
          uVar59 = uVar59 - 1;
          sVar54 = (size_t)(iVar18 + 1);
          lVar64 = lVar64 + 0x14;
          pTVar31 = local_1e8;
        } while (local_260 != uVar59);
      }
      uVar59 = local_2f8;
      if (0 < (int)local_34c) {
        uVar63 = 0;
        do {
          operator_delete(*(void **)((long)local_1b8 + uVar63 * 8),8);
          uVar63 = uVar63 + 1;
        } while (uVar59 != uVar63);
      }
      (*pTVar31->_vptr_ThreadPool[1])(pTVar31);
      sVar57 = *local_1d0;
      psVar56 = local_1d0;
      if (sVar57 != 0) {
        psVar62 = local_1d0 + sVar57 * 3 + 1;
        do {
          sVar7 = psVar62[-1];
          if (sVar7 != 0) {
            lVar64 = *(long *)(sVar7 - 8);
            if (lVar64 != 0) {
              lVar65 = lVar64 * 0x18;
              do {
                pvVar58 = *(void **)((long)(sVar7 - 8) + lVar65);
                if (pvVar58 != (void *)0x0) {
                  operator_delete__(pvVar58);
                }
                lVar65 = lVar65 + -0x18;
              } while (lVar65 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar64 * 0x18 + 8);
            psVar56 = local_1d0;
          }
          psVar62 = psVar62 + -3;
        } while (psVar62 != local_248);
      }
      operator_delete__(psVar56,sVar57 * 0x18 + 8);
      sVar57 = *local_1e0;
      psVar56 = local_1e0;
      if (sVar57 != 0) {
        psVar62 = local_1e0 + sVar57 * 3 + 1;
        do {
          sVar7 = psVar62[-1];
          if (sVar7 != 0) {
            lVar64 = *(long *)(sVar7 - 8);
            if (lVar64 != 0) {
              lVar65 = lVar64 * 0x18;
              do {
                pvVar58 = *(void **)((long)(sVar7 - 8) + lVar65);
                if (pvVar58 != (void *)0x0) {
                  operator_delete__(pvVar58);
                }
                lVar65 = lVar65 + -0x18;
              } while (lVar65 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar64 * 0x18 + 8);
            psVar56 = local_1e0;
          }
          psVar62 = psVar62 + -3;
        } while (psVar62 != local_258);
      }
      operator_delete__(psVar56,sVar57 * 0x18 + 8);
      sVar57 = *local_1d8;
      psVar56 = local_1d8;
      if (sVar57 != 0) {
        psVar62 = local_1d8 + sVar57 * 3 + 1;
        do {
          sVar7 = psVar62[-1];
          if (sVar7 != 0) {
            lVar64 = *(long *)(sVar7 - 8);
            if (lVar64 != 0) {
              lVar65 = lVar64 * 0x18;
              do {
                pvVar58 = *(void **)((long)(sVar7 - 8) + lVar65);
                if (pvVar58 != (void *)0x0) {
                  operator_delete__(pvVar58);
                }
                lVar65 = lVar65 + -0x18;
              } while (lVar65 != 0);
            }
            operator_delete__((void *)(sVar7 - 8),lVar64 * 0x18 + 8);
            psVar56 = local_1d8;
          }
          psVar62 = psVar62 + -3;
        } while (psVar62 != local_250);
      }
      operator_delete__(psVar56,sVar57 * 0x18 + 8);
      if (local_388 != (pointer)0x0) {
        operator_delete(local_388,(long)local_380 - (long)local_388);
      }
      IlmThread_2_5::TaskGroup::~TaskGroup(&local_358);
      Imf_2_5::Array<Imf_2_5::Array2D<Imf_2_5::FrameBuffer>_>::~Array(&local_2c8);
      std::vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_>::~vector
                ((vector<Imf_2_5::FrameBuffer,_std::allocator<Imf_2_5::FrameBuffer>_> *)local_298);
      if ((V2f)local_1b8 != (V2f)0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_348);
      if (local_208.
          super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.
                        super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((Array2D<unsigned_int> *)local_2e8._data != (Array2D<unsigned_int> *)0x0) {
        operator_delete__(local_2e8._data);
      }
      if ((Array2D<float> *)local_318._data != (Array2D<float> *)0x0) {
        operator_delete__(local_318._data);
      }
      if ((Array2D<half> *)local_2b8._data != (Array2D<half> *)0x0) {
        operator_delete__(local_2b8._data);
      }
      plVar15 = local_238[0];
      local_288 = (_Base_ptr)0x0;
      local_298._0_8_ = (Data *)0x0;
      local_298._8_8_ = (pointer)0x0;
      local_348.field_2._M_allocated_capacity = 0;
      local_348._M_dataplus._M_p = (pointer)0x0;
      local_348._M_string_length = 0;
      local_2b8._data = (half *)0x0;
      local_2b8._sizeX = 0;
      local_2b8._sizeY = 0;
      iVar18 = Imf_2_5::globalThreadCount();
      uVar59 = 1;
      Imf_2_5::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_2e8,(char *)plVar15,iVar18,true);
      lVar64 = 0;
      uVar63 = 0;
      while( true ) {
        uVar47 = (undefined4)uVar59;
        iVar18 = Imf_2_5::MultiPartInputFile::parts((MultiPartInputFile *)&local_2e8);
        if ((ulong)(long)iVar18 <= uVar63) break;
        pHVar34 = Imf_2_5::MultiPartInputFile::header((MultiPartInputFile *)&local_2e8,(int)uVar63);
        pBVar35 = Imf_2_5::Header::displayWindow(pHVar34);
        pBVar36 = Imf_2_5::Header::displayWindow
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        iVar18 = -(uint)((pBVar36->min).x == (pBVar35->min).x);
        iVar19 = -(uint)((pBVar36->min).y == (pBVar35->min).y);
        auVar66._4_4_ = iVar18;
        auVar66._0_4_ = iVar18;
        auVar66._8_4_ = iVar19;
        auVar66._12_4_ = iVar19;
        iVar18 = movmskpd(uVar47,auVar66);
        if ((iVar18 != 3) ||
           (iVar19 = -(uint)((pBVar36->max).x == (pBVar35->max).x),
           iVar22 = -(uint)((pBVar36->max).y == (pBVar35->max).y), auVar67._4_4_ = iVar19,
           auVar67._0_4_ = iVar19, auVar67._8_4_ = iVar22, auVar67._12_4_ = iVar22,
           iVar19 = movmskpd((int)pBVar36,auVar67), iVar19 != 3)) {
          __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x292,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pBVar35 = Imf_2_5::Header::dataWindow(pHVar34);
        pBVar36 = Imf_2_5::Header::dataWindow
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        iVar19 = -(uint)((pBVar36->min).x == (pBVar35->min).x);
        iVar22 = -(uint)((pBVar36->min).y == (pBVar35->min).y);
        auVar68._4_4_ = iVar19;
        auVar68._0_4_ = iVar19;
        auVar68._8_4_ = iVar22;
        auVar68._12_4_ = iVar22;
        uVar49 = movmskpd(iVar18,auVar68);
        uVar59 = (ulong)uVar49;
        if ((uVar49 != 3) ||
           (iVar18 = -(uint)((pBVar36->max).x == (pBVar35->max).x),
           iVar19 = -(uint)((pBVar36->max).y == (pBVar35->max).y), auVar69._4_4_ = iVar18,
           auVar69._0_4_ = iVar18, auVar69._8_4_ = iVar19, auVar69._12_4_ = iVar19,
           iVar18 = movmskpd((int)pBVar36,auVar69), iVar18 != 3)) {
          __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x293,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar37 = Imf_2_5::Header::pixelAspectRatio(pHVar34);
        fVar23 = *pfVar37;
        pfVar37 = Imf_2_5::Header::pixelAspectRatio
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        if ((fVar23 != *pfVar37) || (NAN(fVar23) || NAN(*pfVar37))) {
          __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x294,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pVVar38 = Imf_2_5::Header::screenWindowCenter(pHVar34);
        pVVar39 = Imf_2_5::Header::screenWindowCenter
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        if ((((pVVar38->x != pVVar39->x) || (NAN(pVVar38->x) || NAN(pVVar39->x))) ||
            (pVVar38->y != pVVar39->y)) || (NAN(pVVar38->y) || NAN(pVVar39->y))) {
          __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x295,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar37 = Imf_2_5::Header::screenWindowWidth(pHVar34);
        fVar23 = *pfVar37;
        pfVar37 = Imf_2_5::Header::screenWindowWidth
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        if ((fVar23 != *pfVar37) || (NAN(fVar23) || NAN(*pfVar37))) {
          __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x296,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pLVar40 = Imf_2_5::Header::lineOrder(pHVar34);
        LVar3 = *pLVar40;
        pLVar40 = Imf_2_5::Header::lineOrder
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        if (LVar3 != *pLVar40) {
          __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pCVar41 = Imf_2_5::Header::compression(pHVar34);
        CVar4 = *pCVar41;
        pCVar41 = Imf_2_5::Header::compression
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        if (CVar4 != *pCVar41) {
          __assert_fail("header.compression() == headers[i].compression()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pCVar27 = Imf_2_5::Header::channels(pHVar34);
        CVar42 = Imf_2_5::ChannelList::begin(pCVar27);
        pCVar27 = Imf_2_5::Header::channels
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        IVar43 = Imf_2_5::ChannelList::begin(pCVar27);
        local_1b8 = *(undefined1 (*) [8])((long)CVar42._i._M_node + 0x120);
        uStack_1b0 = *(Data **)((long)CVar42._i._M_node + 0x128);
        local_318._sizeX = *(long *)((long)IVar43._i._M_node + 0x120);
        local_318._sizeY = *(long *)((long)IVar43._i._M_node + 0x128);
        bVar17 = Imf_2_5::Channel::operator==((Channel *)local_1b8,(Channel *)&local_318);
        if (!bVar17) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar26 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,", ",2);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,(int)local_318._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26," xSampling ",0xb);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_1b8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,", ",2);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,local_318._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26," ySampling ",0xb);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,(_Rb_tree_color)uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,", ",2);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,(int)local_318._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26," pLinear ",9);
          poVar26 = std::ostream::_M_insert<bool>(SUB81(poVar26,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar26,0));
          std::ostream::flush();
        }
        pCVar27 = Imf_2_5::Header::channels(pHVar34);
        other = Imf_2_5::Header::channels
                          ((Header *)
                           (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 + lVar64)
                          );
        bVar17 = Imf_2_5::ChannelList::operator==(pCVar27,other);
        if (!bVar17) {
          __assert_fail("header.channels() == headers[i].channels()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2a9,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        psVar44 = Imf_2_5::Header::name_abi_cxx11_(pHVar34);
        psVar45 = Imf_2_5::Header::name_abi_cxx11_
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        sVar8 = psVar44->_M_string_length;
        if ((sVar8 != psVar45->_M_string_length) ||
           ((sVar8 != 0 &&
            (iVar18 = bcmp((psVar44->_M_dataplus)._M_p,(psVar45->_M_dataplus)._M_p,sVar8),
            iVar18 != 0)))) {
          __assert_fail("header.name() == headers[i].name()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2aa,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        psVar44 = Imf_2_5::Header::type_abi_cxx11_(pHVar34);
        psVar45 = Imf_2_5::Header::type_abi_cxx11_
                            ((Header *)
                             (&((anonymous_namespace)::headers->_map)._M_t._M_impl.field_0x0 +
                             lVar64));
        sVar8 = psVar44->_M_string_length;
        if ((sVar8 != psVar45->_M_string_length) ||
           ((sVar8 != 0 &&
            (iVar18 = bcmp((psVar44->_M_dataplus)._M_p,(psVar45->_M_dataplus)._M_p,sVar8),
            iVar18 != 0)))) {
          __assert_fail("header.type() == headers[i].type()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                        ,0x2ab,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar63 = uVar63 + 1;
        lVar64 = lVar64 + 0x38;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_318._sizeX = 0;
      local_318._sizeY = 0;
      local_318._data = (float *)0x0;
      uVar59 = ((long)DAT_004a2bc0 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      uVar49 = (uint)uVar59;
      if (0 < (int)uVar49) {
        fVar23 = 0.0;
        do {
          if ((float *)local_318._sizeY == local_318._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_318,(iterator)local_318._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(float *)local_318._sizeY = fVar23;
            local_318._sizeY = local_318._sizeY + 4;
          }
          fVar23 = (float)(local_1b8._0_4_ + 1);
          local_1b8._0_4_ = fVar23;
        } while ((int)fVar23 < (int)uVar49);
        uVar59 = uVar59 & 0xffffffff;
        do {
          iVar18 = random_int(uVar49);
          iVar19 = random_int(uVar49);
          uVar47 = *(undefined4 *)(local_318._sizeX + (long)iVar18 * 4);
          *(undefined4 *)(local_318._sizeX + (long)iVar18 * 4) =
               *(undefined4 *)(local_318._sizeX + (long)iVar19 * 4);
          *(undefined4 *)(local_318._sizeX + (long)iVar19 * 4) = uVar47;
          uVar50 = (int)uVar59 - 1;
          uVar59 = (ulong)uVar50;
        } while (uVar50 != 0);
        uVar59 = 0;
        do {
          iVar18 = *(int *)(local_318._sizeX + uVar59 * 4);
          lVar64 = (long)iVar18;
          if (*(int *)((anonymous_namespace)::partTypes + lVar64 * 4) == 0) {
            uStack_1b0 = (Data *)((ulong)uStack_1b0._4_4_ << 0x20);
            local_1a8 = (_Base_ptr)0x0;
            local_1a0 = (_Base_ptr)&uStack_1b0;
            local_190 = 0;
            local_198 = local_1a0;
            setInputFrameBuffer((FrameBuffer *)local_1b8,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar64 * 4),
                                (Array2D<unsigned_int> *)local_298,(Array2D<float> *)&local_348,
                                &local_2b8,0xc5,0x107);
            Imf_2_5::InputPart::InputPart
                      ((InputPart *)&local_208,(MultiPartInputFile *)&local_2e8,iVar18);
            Imf_2_5::InputPart::setFrameBuffer((InputPart *)&local_208,(FrameBuffer *)local_1b8);
            Imf_2_5::InputPart::readPixels((InputPart *)&local_208,0,0x106);
            iVar18 = *(int *)((anonymous_namespace)::pixelTypes + lVar64 * 4);
            if (iVar18 == 0) {
              bVar17 = checkPixels<unsigned_int>
                                 ((Array2D<unsigned_int> *)local_298,0,0xc4,0,0x106,0xc5);
              if (!bVar17) {
                __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                              ,0x2d4,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if (iVar18 == 1) {
              bVar17 = checkPixels<float>((Array2D<float> *)&local_348,0,0xc4,0,0x106,0xc5);
              if (!bVar17) {
                __assert_fail("checkPixels<float>(fData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                              ,0x2d7,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if ((iVar18 == 2) &&
                    (bVar17 = checkPixels<half>(&local_2b8,0,0xc4,0,0x106,0xc5), !bVar17)) {
              __assert_fail("checkPixels<half>(hData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                            ,0x2da,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else {
            uStack_1b0 = (Data *)((ulong)uStack_1b0._4_4_ << 0x20);
            local_1a8 = (_Base_ptr)0x0;
            local_1a0 = (_Base_ptr)&uStack_1b0;
            local_190 = 0;
            local_198 = local_1a0;
            Imf_2_5::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&local_208,(MultiPartInputFile *)&local_2e8,iVar18);
            iVar18 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&local_208);
            iVar19 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&local_208);
            if (0 < iVar18) {
              iVar22 = 0;
              do {
                if (0 < iVar19) {
                  iVar51 = 0;
                  do {
                    bVar17 = Imf_2_5::TiledInputPart::isValidLevel
                                       ((TiledInputPart *)&local_208,iVar22,iVar51);
                    if (bVar17) {
                      iVar20 = Imf_2_5::TiledInputPart::levelWidth
                                         ((TiledInputPart *)&local_208,iVar22);
                      iVar21 = Imf_2_5::TiledInputPart::levelHeight
                                         ((TiledInputPart *)&local_208,iVar51);
                      setInputFrameBuffer((FrameBuffer *)local_1b8,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar64 * 4),
                                          (Array2D<unsigned_int> *)local_298,
                                          (Array2D<float> *)&local_348,&local_2b8,0xc5,0x107);
                      Imf_2_5::TiledInputPart::setFrameBuffer
                                ((TiledInputPart *)&local_208,(FrameBuffer *)local_1b8);
                      iVar24 = Imf_2_5::TiledInputPart::numXTiles
                                         ((TiledInputPart *)&local_208,iVar22);
                      iVar25 = Imf_2_5::TiledInputPart::numYTiles
                                         ((TiledInputPart *)&local_208,iVar51);
                      Imf_2_5::TiledInputPart::readTiles
                                ((TiledInputPart *)&local_208,0,iVar24 + -1,0,iVar25 + -1,iVar22,
                                 iVar51);
                      iVar24 = *(int *)((anonymous_namespace)::pixelTypes + lVar64 * 4);
                      if (iVar24 == 0) {
                        bVar17 = checkPixels<unsigned_int>
                                           ((Array2D<unsigned_int> *)local_298,0,iVar20 + -1,0,
                                            iVar21 + -1,iVar20);
                        if (!bVar17) {
                          __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                        ,0x2f7,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if (iVar24 == 1) {
                        bVar17 = checkPixels<float>((Array2D<float> *)&local_348,0,iVar20 + -1,0,
                                                    iVar21 + -1,iVar20);
                        if (!bVar17) {
                          __assert_fail("checkPixels<float>(fData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                        ,0x2fa,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if ((iVar24 == 2) &&
                              (bVar17 = checkPixels<half>(&local_2b8,0,iVar20 + -1,0,iVar21 + -1,
                                                          iVar20), !bVar17)) {
                        __assert_fail("checkPixels<half>(hData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                                      ,0x2fd,
                                      "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                     );
                      }
                    }
                    iVar51 = iVar51 + 1;
                  } while (iVar19 != iVar51);
                }
                iVar22 = iVar22 + 1;
              } while (iVar22 != iVar18);
            }
          }
          std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                       *)local_1b8);
          uVar59 = uVar59 + 1;
        } while (uVar59 != (uVar49 & 0x7fffffff));
        if ((void *)local_318._sizeX != (void *)0x0) {
          operator_delete((void *)local_318._sizeX,(long)local_318._data - local_318._sizeX);
        }
      }
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_2e8);
      if (local_2b8._data != (half *)0x0) {
        operator_delete__(local_2b8._data);
      }
      if ((void *)local_348.field_2._M_allocated_capacity != (void *)0x0) {
        operator_delete__((void *)local_348.field_2._M_allocated_capacity);
      }
      if (local_288 != (_Base_ptr)0x0) {
        operator_delete__(local_288);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar15 = local_238[0];
      iVar18 = Imf_2_5::globalThreadCount();
      Imf_2_5::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar15,iVar18,true);
      IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)local_298);
      pTVar31 = (ThreadPool *)operator_new(0x10);
      IlmThread_2_5::ThreadPool::ThreadPool(pTVar31,0x20);
      iVar18 = local_210;
      if (0 < local_210) {
        do {
          pTVar46 = (Task *)operator_new(0x18);
          IlmThread_2_5::Task::Task(pTVar46,(TaskGroup *)local_298);
          pTVar46->_vptr_Task = (_func_int **)&PTR__Task_0049c518;
          pTVar46[1]._vptr_Task = (_func_int **)local_1b8;
          IlmThread_2_5::ThreadPool::addTask(pTVar31,pTVar46);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      (*pTVar31->_vptr_ThreadPool[1])(pTVar31);
      IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)local_298);
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)local_1b8);
      remove((char *)local_238[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      iVar18 = local_20c;
      std::ostream::put('p');
      std::ostream::flush();
      std::ostream::flush();
      iVar18 = iVar18 + 1;
    } while (iVar18 != local_214);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (int partNumber,
               int runCount,
               int randomReadCount,
               const std::string & tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir +  "imf_test_multipart_api.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str());

        cout << endl << flush;
    }
}